

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O0

LispPTR get_ivar_name(frameex1 *fx_addr68k,DLword offset,int *localivar)

{
  uint uVar1;
  uint uVar2;
  LispPTR *pLVar3;
  bool bVar4;
  int local_44;
  int delta;
  int i;
  fnhead *fnobj;
  LispPTR *second_table;
  LispPTR *first_table;
  int *localivar_local;
  DLword offset_local;
  frameex1 *fx_addr68k_local;
  
  pLVar3 = NativeAligned4FromLAddr(fx_addr68k->fnheader);
  if (*(short *)((long)pLVar3 + 0xe) == 0) {
    second_table = pLVar3 + 6;
    fnobj = (fnhead *)
            (second_table +
            ((int)((long)pLVar3 +
                   ((long)((int)(uint)(ushort)pLVar3[1] >> 1) * 2 - (long)second_table) >> 1) >> 2))
    ;
  }
  else {
    second_table = pLVar3 + 4;
    fnobj = (fnhead *)((long)second_table + (long)(int)(uint)*(ushort *)((long)pLVar3 + 0xe) * 2);
    local_44 = 0;
    while( true ) {
      bVar4 = false;
      if (local_44 < (int)(uint)*(ushort *)((long)pLVar3 + 0xe)) {
        uVar1._0_2_ = fnobj->na;
        uVar1._2_2_ = fnobj->stkmin;
        bVar4 = uVar1 != offset;
      }
      if (!bVar4) break;
      second_table = second_table + 1;
      fnobj = (fnhead *)&fnobj->startpc;
      local_44 = local_44 + 1;
    }
    if ((local_44 < (int)(uint)*(ushort *)((long)pLVar3 + 0xe)) && (*second_table != 0)) {
      *localivar = 0;
      return *second_table;
    }
    second_table = pLVar3 + (long)(int)(uint)*(ushort *)((long)pLVar3 + 0xe) + 4;
    fnobj = (fnhead *)
            (second_table +
            ((long)pLVar3 + ((long)((int)(uint)(ushort)pLVar3[1] >> 1) * 2 - (long)second_table) >>
            3));
  }
  for (; uVar2._0_2_ = fnobj->na, uVar2._2_2_ = fnobj->stkmin, uVar2 != offset;
      fnobj = (fnhead *)&fnobj->startpc) {
    second_table = second_table + 1;
  }
  *localivar = 1;
  return *second_table;
}

Assistant:

LispPTR get_ivar_name(struct frameex1 *fx_addr68k, DLword offset, int *localivar) {
  NAMETABLE *first_table;
  NAMETABLE *second_table;
  struct fnhead *fnobj;
  int i;
#ifdef BIGVM
  fnobj = (struct fnhead *)NativeAligned4FromLAddr((fx_addr68k)->fnheader);
#else
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(((int)(fx_addr68k)->hi2fnheader << 16) |
                                              (fx_addr68k)->lofnheader);
#endif /* BIGVM */
  if (fnobj->ntsize > 0) {
    /* name table exists */
    first_table = (NAMETABLE *)(fnobj + 1);
    second_table = (NAMETABLE *)((DLword *)first_table + fnobj->ntsize);

    for (i = 0; (i < fnobj->ntsize) && (GetNTEntry(second_table) != offset);
         first_table++, second_table++, i++)
      ;
    if ((i < fnobj->ntsize) && (GetNTEntry(first_table) != 0)) {
      /* target ivar was in name table */
      *localivar = 0;
      return ((LispPTR)(GetNTEntry(first_table)));
    } else {
/* Target ivar is in locar vars table */
#ifdef BIGATOMS
      first_table = (NAMETABLE *)(fnobj + 1) + (fnobj->ntsize);
      second_table =
          first_table + (((DLword *)fnobj + (fnobj->startpc >> 1) - (DLword *)first_table) >> 2);
#else
      first_table = (NAMETABLE *)(fnobj + 1) + (fnobj->ntsize << 1);
      second_table = first_table + (((DLword *)fnobj + (fnobj->startpc >> 1) - first_table) >> 1);
#endif
    }
  } else {
/* name table doesn't exist, so all ivars are in locar vars table */
#ifdef BIGATOMS
    int delta;
    first_table = (NAMETABLE *)(fnobj + 1) + (4 >> 1);
    delta = (DLword *)(((DLword *)fnobj) + (fnobj->startpc >> 1)) - (DLword *)first_table;
    second_table = first_table + (delta >> 2);
#else
    first_table = (NAMETABLE *)(fnobj + 1) + 4;
    second_table = first_table + (((DLword *)fnobj + (fnobj->startpc >> 1) - first_table) >> 1);
#endif
  }
#ifdef BIGATOMS
  while (*(second_table) != (VTY_IVAR | offset))
#else
  while (GETWORD(second_table) != (VTY_IVAR | offset))
#endif /* BIGATOMS */

  {
    first_table++;
    second_table++;
  }
  *localivar = 1;

#ifdef BIGATOMS
  return ((LispPTR)(*(first_table)));
#else
  return ((LispPTR)(GETWORD(first_table)));
#endif /* BIGATOMS */

}